

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::operator+=(ChebyshevExpansion *this,ChebyshevExpansion *donor)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  char *pcVar5;
  Index new_rows;
  ulong uVar6;
  ulong uVar7;
  Index index;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  Index size;
  Index size_1;
  ulong uVar12;
  
  pdVar2 = (donor->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar7 = (donor->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar6 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar12 = uVar7;
  uVar9 = uVar6;
  if (uVar7 < uVar6) {
    uVar12 = uVar6;
    uVar9 = uVar7;
  }
  if (-1 < (long)uVar9 || pdVar2 == (double *)0x0) {
    if (((long)uVar9 < 0) || ((long)uVar7 < (long)uVar9)) {
LAB_00103b23:
      pcVar5 = 
      "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_00103b4f;
    }
    if ((long)uVar9 <= (long)uVar6) {
      pdVar3 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      uVar8 = uVar9;
      if ((((ulong)pdVar3 & 7) == 0) &&
         (uVar8 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1), (long)uVar9 <= (long)uVar8)) {
        uVar8 = uVar9;
      }
      lVar10 = uVar9 - uVar8;
      if (0 < (long)uVar8) {
        uVar11 = 0;
        do {
          pdVar3[uVar11] = pdVar2[uVar11] + pdVar3[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
      uVar11 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
      if (1 < lVar10) {
        do {
          dVar4 = (pdVar2 + uVar8)[1];
          dVar1 = (pdVar3 + uVar8)[1];
          pdVar3[uVar8] = pdVar2[uVar8] + pdVar3[uVar8];
          (pdVar3 + uVar8)[1] = dVar4 + dVar1;
          uVar8 = uVar8 + 2;
        } while ((long)uVar8 < (long)uVar11);
      }
      if ((long)uVar11 < (long)uVar9) {
        do {
          pdVar3[uVar11] = pdVar2[uVar11] + pdVar3[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      if (uVar7 <= uVar6) {
        return this;
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
                ((DenseStorage<double,__1,__1,_1,_0> *)this,uVar7,uVar7,1);
      uVar12 = uVar12 - uVar9;
      pdVar2 = (donor->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_data;
      if ((long)uVar12 < 0 && pdVar2 != (double *)0x0) goto LAB_00103b0c;
      uVar7 = (donor->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows - uVar12;
      if ((long)(uVar7 | uVar12) < 0) goto LAB_00103b23;
      pdVar3 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (pdVar3 != (double *)0x0 && (long)uVar12 < 0) {
        pcVar5 = 
        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
        ;
        goto LAB_00103b6e;
      }
      uVar6 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows - uVar12;
      if (-1 < (long)(uVar6 | uVar12)) {
        pdVar3 = pdVar3 + uVar6;
        uVar6 = uVar12;
        if ((((ulong)pdVar3 & 7) == 0) &&
           (uVar6 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1), (long)uVar12 <= (long)uVar6)) {
          uVar6 = uVar12;
        }
        lVar10 = uVar12 - uVar6;
        if (0 < (long)uVar6) {
          uVar9 = 0;
          do {
            pdVar3[uVar9] = pdVar2[uVar7 + uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar6 != uVar9);
        }
        uVar9 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar6;
        if (1 < lVar10) {
          do {
            dVar1 = (pdVar2 + uVar7 + uVar6)[1];
            pdVar3[uVar6] = pdVar2[uVar7 + uVar6];
            (pdVar3 + uVar6)[1] = dVar1;
            uVar6 = uVar6 + 2;
          } while ((long)uVar6 < (long)uVar9);
        }
        if ((long)uVar12 <= (long)uVar9) {
          return this;
        }
        do {
          pdVar3[uVar9] = pdVar2[uVar7 + uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar12 != uVar9);
        return this;
      }
    }
    pcVar5 = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
LAB_00103b4f:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                  ,0x93,pcVar5);
  }
LAB_00103b0c:
  pcVar5 = 
  "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
  ;
LAB_00103b6e:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,pcVar5);
}

Assistant:

ChebyshevExpansion& ChebyshevExpansion::operator+=(const ChebyshevExpansion &donor) {
        std::size_t Ndonor = donor.coef().size(), N1 = m_c.size();
        std::size_t Nmin = std::min(N1, Ndonor), Nmax = std::max(N1, Ndonor);
        // The first Nmin terms overlap between the two vectors
        m_c.head(Nmin) += donor.coef().head(Nmin);
        // If the donor vector is longer than the current vector, resizing is needed
        if (Ndonor > N1) {
            // Resize but leave values as they were
            m_c.conservativeResize(Ndonor);
            // Copy the last Nmax-Nmin values from the donor
            m_c.tail(Nmax - Nmin) = donor.coef().tail(Nmax - Nmin);
        }
        return *this;
    }